

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::UnpackedStructType::fromSyntax(ASTContext *context,StructUnionTypeSyntax *syntax)

{
  TokenKind TVar1;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar2;
  int iVar3;
  reference ppSVar4;
  size_type sVar5;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  *extraout_RDX;
  SyntaxNode *in_RSI;
  ASTContext *in_RDI;
  iterator iVar6;
  string_view sVar7;
  FieldSymbol *field_1;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range2_1;
  FieldSymbol *field;
  DeclaratorSyntax *decl;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range3;
  RandMode randMode;
  StructUnionMemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *__range2;
  SmallVector<const_slang::ast::FieldSymbol_*,_5UL> fields;
  uint64_t bitstreamWidth;
  uint64_t bitOffset;
  UnpackedStructType *result;
  Compilation *comp;
  SyntaxNode *in_stack_000003e8;
  Scope *in_stack_000003f0;
  ValueSymbol *in_stack_fffffffffffffd88;
  ValueSymbol *in_stack_fffffffffffffd90;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  *__lhs;
  Type *in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  Compilation *in_stack_fffffffffffffda8;
  BumpAllocator *in_stack_fffffffffffffdb0;
  Scope *in_stack_fffffffffffffdb8;
  Symbol *in_stack_fffffffffffffdc0;
  Type *in_stack_fffffffffffffdc8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdd0;
  DeclaredType *in_stack_fffffffffffffde0;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_170;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_168;
  span<const_slang::ast::FieldSymbol_*,_18446744073709551615UL> *local_160;
  pointer local_150;
  size_t local_148;
  undefined4 local_13c;
  SourceRange local_138;
  undefined4 local_128;
  bitmask<slang::ast::DeclaredTypeFlags> local_124;
  DeclaredType *local_120;
  undefined4 local_104;
  SourceLocation local_100;
  string_view local_f8;
  FieldSymbol *local_e8;
  DeclaratorSyntax *local_e0;
  iterator local_d8;
  iterator local_c8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_b8;
  RandMode local_b0;
  StructUnionMemberSyntax *local_a0;
  StructUnionMemberSyntax **local_98;
  __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
  local_90;
  SyntaxNode **local_88;
  SmallVectorBase<const_slang::ast::FieldSymbol_*> local_80 [2];
  uint64_t local_40;
  uint64_t local_38;
  SourceLocation local_30;
  UnpackedStructType *local_28;
  Compilation *local_20;
  SyntaxNode *local_18;
  ASTContext *local_10;
  UnpackedStructType *local_8;
  span<const_slang::ast::FieldSymbol_*,_18446744073709551615UL> *__s;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x725036);
  local_30 = parsing::Token::location((Token *)(local_18 + 1));
  local_28 = BumpAllocator::
             emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        (SourceLocation *)in_stack_fffffffffffffda0,
                        (ASTContext *)in_stack_fffffffffffffd98);
  local_38 = 0;
  local_40 = 0;
  SmallVector<const_slang::ast::FieldSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FieldSymbol_*,_5UL> *)0x7250c9);
  local_88 = &local_18[4].parent;
  local_90._M_current =
       (StructUnionMemberSyntax **)
       std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffd88);
  local_98 = (StructUnionMemberSyntax **)
             std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                        in_stack_fffffffffffffd98);
  do {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_28->selectableWidth = local_38;
      local_28->bitstreamWidth = local_40;
      iVar3 = SmallVectorBase<const_slang::ast::FieldSymbol_*>::copy
                        (local_80,(EVP_PKEY_CTX *)local_20,src);
      __s = (span<const_slang::ast::FieldSymbol_*,_18446744073709551615UL> *)
            CONCAT44(extraout_var,iVar3);
      __lhs = extraout_RDX;
      local_160 = __s;
      std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::
      span<const_slang::ast::FieldSymbol_*,_18446744073709551615UL>
                ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffda0,__s);
      (local_28->fields)._M_ptr = local_150;
      (local_28->fields)._M_extent._M_extent_value = local_148;
      local_168 = &local_28->fields;
      local_170._M_current =
           (FieldSymbol **)
           std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffd88);
      std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)__s);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                          (__lhs,(__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                  *)in_stack_fffffffffffffd88);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
        ::operator*(&local_170);
        ValueSymbol::getInitializer((ValueSymbol *)0x7257a7);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_170);
      }
      Symbol::setSyntax((Symbol *)local_28,local_18);
      local_8 = local_28;
LAB_007257ec:
      local_13c = 1;
      SmallVector<const_slang::ast::FieldSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::FieldSymbol_*,_5UL> *)0x7257f9);
      return &local_8->super_Type;
    }
    ppSVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_90);
    local_a0 = *ppSVar4;
    if ((local_a0->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_000003f0,in_stack_000003e8);
    }
    local_b0 = None;
    TVar1 = (local_a0->randomQualifier).kind;
    if (TVar1 == RandKeyword) {
      local_b0 = Rand;
    }
    else if (TVar1 == RandCKeyword) {
      local_b0 = RandC;
    }
    local_b8 = &local_a0->declarators;
    iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x725219);
    local_c8 = iVar6;
    iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
                       in_stack_fffffffffffffd90);
    local_d8 = iVar6;
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffd90,
                         (iterator_base<slang::syntax::DeclaratorSyntax_*> *)
                         in_stack_fffffffffffffd88);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_e0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                              *)0x7252c7);
      sVar7 = parsing::Token::valueText(in_stack_fffffffffffffda0);
      local_f8 = sVar7;
      local_100 = parsing::Token::location(&local_e0->name);
      sVar5 = SmallVectorBase<const_slang::ast::FieldSymbol_*>::size(local_80);
      local_104 = (undefined4)sVar5;
      local_e8 = BumpAllocator::
                 emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_long&,unsigned_int>
                           ((BumpAllocator *)in_stack_fffffffffffffdc0,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffdb8,(SourceLocation *)in_stack_fffffffffffffdb0,
                            (unsigned_long *)in_stack_fffffffffffffda8,
                            (uint *)in_stack_fffffffffffffda0);
      not_null<slang::syntax::DataTypeSyntax_*>::operator*
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x7253d8);
      ValueSymbol::setDeclaredType
                (in_stack_fffffffffffffd90,(DataTypeSyntax *)in_stack_fffffffffffffd88);
      ValueSymbol::setFromDeclarator
                (in_stack_fffffffffffffd90,(DeclaratorSyntax *)in_stack_fffffffffffffd88);
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x725427);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffda0,
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd98);
      syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffdd0._M_extent_value;
      syntax_00._M_ptr = (pointer)in_stack_fffffffffffffdc8;
      Symbol::setAttributes(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,syntax_00);
      local_e8->randMode = local_b0;
      if (local_b0 != None) {
        local_120 = (DeclaredType *)ValueSymbol::getDeclaredType(in_stack_fffffffffffffd88);
        in_stack_fffffffffffffde0 =
             not_null<slang::ast::DeclaredType_*>::operator->
                       ((not_null<slang::ast::DeclaredType_*> *)0x7254b5);
        bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_124,Rand);
        DeclaredType::addFlags
                  ((DeclaredType *)in_stack_fffffffffffffd88,
                   (bitmask<slang::ast::DeclaredTypeFlags>)
                   (underlying_type)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      }
      Scope::addMember((Scope *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->super_Symbol);
      SmallVectorBase<const_slang::ast::FieldSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::FieldSymbol_*> *)in_stack_fffffffffffffd90,
                 (FieldSymbol **)in_stack_fffffffffffffd88);
      ValueSymbol::getType((ValueSymbol *)0x725522);
      in_stack_fffffffffffffdd0._M_extent_value =
           Type::getSelectableWidth(in_stack_fffffffffffffd98);
      local_38 = local_38 + in_stack_fffffffffffffdd0._M_extent_value;
      in_stack_fffffffffffffdc8 = ValueSymbol::getType((ValueSymbol *)0x72555f);
      in_stack_fffffffffffffdc0 = (Symbol *)Type::getBitstreamWidth(in_stack_fffffffffffffd98);
      local_40 = (long)&in_stack_fffffffffffffdc0->kind + local_40;
      if ((0x3fffffff8 < local_38) || (0x3fffffff8 < local_40)) {
        local_128 = 0x180009;
        local_138 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffde0);
        sourceRange.endLoc = local_138.startLoc;
        sourceRange.startLoc = local_138.endLoc;
        ASTContext::addDiag(local_10,SUB84((ulong)in_stack_fffffffffffffdc0 >> 0x20,0),sourceRange);
        local_8 = (UnpackedStructType *)Compilation::getErrorType(local_20);
        goto LAB_007257ec;
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                  *)in_stack_fffffffffffffd90);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

const Type& UnpackedStructType::fromSyntax(const ASTContext& context,
                                           const StructUnionTypeSyntax& syntax) {
    SLANG_ASSERT(!syntax.packed);

    auto& comp = context.getCompilation();
    auto result = comp.emplace<UnpackedStructType>(comp, syntax.keyword.location(), context);

    uint64_t bitOffset = 0;
    uint64_t bitstreamWidth = 0;
    SmallVector<const FieldSymbol*> fields;
    for (auto member : syntax.members) {
        if (member->previewNode)
            result->addMembers(*member->previewNode);

        RandMode randMode = RandMode::None;
        switch (member->randomQualifier.kind) {
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            default:
                break;
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   bitOffset, (uint32_t)fields.size());
            field->setDeclaredType(*member->type);
            field->setFromDeclarator(*decl);
            field->setAttributes(*context.scope, member->attributes);
            field->randMode = randMode;

            if (randMode != RandMode::None)
                field->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

            result->addMember(*field);
            fields.push_back(field);

            bitOffset += field->getType().getSelectableWidth();
            bitstreamWidth += field->getType().getBitstreamWidth();
            if (bitOffset > MaxBitWidth || bitstreamWidth > MaxBitWidth) {
                context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
                return comp.getErrorType();
            }
        }
    }

    result->selectableWidth = bitOffset;
    result->bitstreamWidth = bitstreamWidth;
    result->fields = fields.copy(comp);
    for (auto field : result->fields) {
        // Force resolution of the initializer right away, otherwise nothing
        // is required to force it later.
        field->getInitializer();
    }

    result->setSyntax(syntax);
    return *result;
}